

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Maybe<kj::Promise<void_*>_> __thiscall
capnp::LocalClient::getLocalServer(LocalClient *this,CapabilityServerSetBase *capServerSet)

{
  PromiseArenaMember *node;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 extraout_RDX_01;
  Maybe<kj::Promise<void_*>_> MVar1;
  void *continuationTracePtr;
  PromiseArenaMember *local_30;
  code *local_28;
  anon_class_8_1_8991fb9c_for_func local_20;
  
  if (*(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void_*>_>_2 *)(capServerSet + 0x30) ==
      in_RDX) {
    if (capServerSet[0x78] == (CapabilityServerSetBase)0x1) {
      kj::newAdaptedPromise<kj::Promise<void>,capnp::LocalClient::BlockedCall,capnp::LocalClient&>
                ((kj *)&local_30,(LocalClient *)capServerSet);
      local_28 = kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:714:19)>
                 ::anon_class_8_1_8991fb9c_for_func::operator();
      local_20.this = (LocalClient *)capServerSet;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::LocalClient::getLocalServer(capnp::_::CapabilityServerSetBase&)::_lambda()_1_>,kj::_::PromiseDisposer,capnp::LocalClient::getLocalServer(capnp::_::CapabilityServerSetBase&)::_lambda()_1_,void*&>
                ((PromiseDisposer *)&(this->super_ClientHook).brand,(OwnPromiseNode *)&local_30,
                 &local_20,&local_28);
      node = local_30;
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      in_RDX = extraout_RDX;
      if (local_30 != (PromiseArenaMember *)0x0) {
        local_30 = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose(node);
        in_RDX = extraout_RDX_00;
      }
    }
    else {
      local_28 = *(code **)(capServerSet + 0x38);
      kj::_::PromiseDisposer::alloc<kj::_::ImmediatePromiseNode<void*>,kj::_::PromiseDisposer,void*>
                ((PromiseDisposer *)&(this->super_ClientHook).brand,&local_28);
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      in_RDX = extraout_RDX_01;
    }
  }
  else {
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
  }
  MVar1.ptr.field_1 = in_RDX;
  MVar1.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void_*>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void*>> getLocalServer(_::CapabilityServerSetBase& capServerSet) {
    // If this is a local capability created through `capServerSet`, return the underlying Server.
    // Otherwise, return nullptr. Default implementation (which everyone except LocalClient should
    // use) always returns nullptr.

    if (this->capServerSet == &capServerSet) {
      if (blocked) {
        // If streaming calls are in-flight, it could be the case that they were originally sent
        // over RPC and reflected back, before the capability had resolved to a local object. In
        // that case, the client may already perceive these calls as "done" because the RPC
        // implementation caused the client promise to resolve early. However, the capability is
        // now local, and the app is trying to break through the LocalClient wrapper and access
        // the server directly, bypassing the stream queue. Since the app thinks that all
        // previous calls already completed, it may then try to queue a new call directly on the
        // server, jumping the queue.
        //
        // We can solve this by delaying getLocalServer() until all current streaming calls have
        // finished. Note that if a new streaming call is started *after* this point, we need not
        // worry about that, because in this case it is presumably a local call and the caller
        // won't be informed of completion until the call actually does complete. Thus the caller
        // is well-aware that this call is still in-flight.
        //
        // However, the app still cannot assume that there aren't multiple clients, perhaps even
        // a malicious client that tries to send stream requests that overlap with the app's
        // direct use of the server... so it's up to the app to check for and guard against
        // concurrent calls after using getLocalServer().
        return kj::newAdaptedPromise<kj::Promise<void>, BlockedCall>(*this)
            .then([this]() { return ptr; });
      } else {
        return kj::Promise<void*>(ptr);
      }
    } else {
      return kj::none;
    }
  }